

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_lpf1_clear_cache(ma_lpf1 *pLPF)

{
  ma_lpf1 *pLPF_local;
  ma_result local_4;
  
  if (pLPF == (ma_lpf1 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (pLPF->format == ma_format_f32) {
      (pLPF->a).f32 = 0.0;
    }
    else {
      (pLPF->a).f32 = 0.0;
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_lpf1_clear_cache(ma_lpf1* pLPF)
{
    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pLPF->format == ma_format_f32) {
        pLPF->a.f32 = 0;
    } else {
        pLPF->a.s32 = 0;
    }

    return MA_SUCCESS;
}